

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

bool __thiscall wabt::WastLexer::MatchString(WastLexer *this,string_view s)

{
  char cVar1;
  byte *pbVar2;
  uint uVar3;
  size_type sVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  if (s.size_ != 0) {
    pbVar2 = (byte *)this->cursor_;
    sVar4 = 0;
    pbVar5 = pbVar2;
    do {
      cVar1 = s.data_[sVar4];
      uVar3 = 0xffffffff;
      pbVar6 = pbVar5;
      if (pbVar5 < this->buffer_end_) {
        pbVar6 = pbVar5 + 1;
        this->cursor_ = (char *)pbVar6;
        uVar3 = (uint)*pbVar5;
      }
      if (uVar3 != (int)cVar1) {
        this->cursor_ = (char *)pbVar2;
        return false;
      }
      sVar4 = sVar4 + 1;
      pbVar5 = pbVar6;
    } while (s.size_ != sVar4);
  }
  return true;
}

Assistant:

bool WastLexer::MatchString(string_view s) {
  const char* saved_cursor = cursor_;
  for (char c : s) {
    if (ReadChar() != c) {
      cursor_ = saved_cursor;
      return false;
    }
  }
  return true;
}